

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry_strmode.c
# Opt level: O0

char * archive_entry_strmode(archive_entry_conflict *entry)

{
  mode_t mVar1;
  mode_t mVar2;
  wchar_t wVar3;
  char *__dest;
  char *pcVar4;
  int local_20;
  wchar_t i;
  mode_t mode;
  char *bp;
  archive_entry_conflict *entry_local;
  
  __dest = entry->strmode;
  strcpy(__dest,"?rwxrwxrwx ");
  mVar1 = archive_entry_mode((archive_entry *)entry);
  mVar2 = archive_entry_filetype((archive_entry *)entry);
  if (mVar2 == 0x1000) {
    *__dest = 'p';
  }
  else if (mVar2 == 0x2000) {
    *__dest = 'c';
  }
  else if (mVar2 == 0x4000) {
    *__dest = 'd';
  }
  else if (mVar2 == 0x6000) {
    *__dest = 'b';
  }
  else if (mVar2 == 0x8000) {
    *__dest = '-';
  }
  else if (mVar2 == 0xa000) {
    *__dest = 'l';
  }
  else if (mVar2 == 0xc000) {
    *__dest = 's';
  }
  else {
    pcVar4 = archive_entry_hardlink((archive_entry *)entry);
    if (pcVar4 != (char *)0x0) {
      *__dest = 'h';
    }
  }
  for (local_20 = 0; local_20 < 9; local_20 = local_20 + 1) {
    if ((mVar1 & archive_entry_strmode::permbits[local_20]) == 0) {
      __dest[local_20 + 1] = '-';
    }
  }
  if ((mVar1 & 0x800) != 0) {
    if ((mVar1 & 0x40) == 0) {
      entry->strmode[3] = 'S';
    }
    else {
      entry->strmode[3] = 's';
    }
  }
  if ((mVar1 & 0x400) != 0) {
    if ((mVar1 & 8) == 0) {
      entry->strmode[6] = 'S';
    }
    else {
      entry->strmode[6] = 's';
    }
  }
  if ((mVar1 & 0x200) != 0) {
    if ((mVar1 & 1) == 0) {
      entry->strmode[9] = 'T';
    }
    else {
      entry->strmode[9] = 't';
    }
  }
  wVar3 = archive_entry_acl_types((archive_entry *)entry);
  if (wVar3 != L'\0') {
    entry->strmode[10] = '+';
  }
  return __dest;
}

Assistant:

const char *
archive_entry_strmode(struct archive_entry *entry)
{
	static const mode_t permbits[] =
	    { 0400, 0200, 0100, 0040, 0020, 0010, 0004, 0002, 0001 };
	char *bp = entry->strmode;
	mode_t mode;
	int i;

	/* Fill in a default string, then selectively override. */
	strcpy(bp, "?rwxrwxrwx ");

	mode = archive_entry_mode(entry);
	switch (archive_entry_filetype(entry)) {
	case AE_IFREG:  bp[0] = '-'; break;
	case AE_IFBLK:  bp[0] = 'b'; break;
	case AE_IFCHR:  bp[0] = 'c'; break;
	case AE_IFDIR:  bp[0] = 'd'; break;
	case AE_IFLNK:  bp[0] = 'l'; break;
	case AE_IFSOCK: bp[0] = 's'; break;
	case AE_IFIFO:  bp[0] = 'p'; break;
	default:
		if (archive_entry_hardlink(entry) != NULL) {
			bp[0] = 'h';
			break;
		}
	}

	for (i = 0; i < 9; i++)
		if (!(mode & permbits[i]))
			bp[i+1] = '-';

	if (mode & S_ISUID) {
		if (mode & 0100) bp[3] = 's';
		else bp[3] = 'S';
	}
	if (mode & S_ISGID) {
		if (mode & 0010) bp[6] = 's';
		else bp[6] = 'S';
	}
	if (mode & S_ISVTX) {
		if (mode & 0001) bp[9] = 't';
		else bp[9] = 'T';
	}
	if (archive_entry_acl_types(entry) != 0)
		bp[10] = '+';

	return (bp);
}